

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_utf8(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  uint32_t len;
  bson_iter_t iter;
  undefined8 uStack_188;
  int local_104;
  undefined1 local_100 [224];
  
  local_104 = 0;
  uVar3 = bson_new();
  cVar1 = bson_append_utf8(uVar3,"foo",0xffffffffffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_utf8 (b, \"foo\", -1, \"bar\", -1)";
    uStack_188 = 0x41;
  }
  else {
    cVar1 = bson_append_utf8(uVar3,"bar",0xffffffffffffffff,"baz",0xffffffff);
    if (cVar1 == '\0') {
      pcVar4 = "bson_append_utf8 (b, \"bar\", -1, \"baz\", -1)";
      uStack_188 = 0x42;
    }
    else {
      cVar1 = bson_iter_init(local_100,uVar3);
      if (cVar1 == '\0') {
        pcVar4 = "bson_iter_init (&iter, b)";
        uStack_188 = 0x43;
      }
      else {
        cVar1 = bson_iter_next(local_100);
        if (cVar1 == '\0') {
          pcVar4 = "bson_iter_next (&iter)";
          uStack_188 = 0x44;
        }
        else {
          iVar2 = bson_iter_type(local_100);
          if (iVar2 == 2) {
            pcVar4 = (char *)bson_iter_key(local_100);
            iVar2 = strcmp(pcVar4,"foo");
            if (iVar2 == 0) {
              pcVar4 = (char *)bson_iter_utf8(local_100,0);
              iVar2 = strcmp(pcVar4,"bar");
              if (iVar2 == 0) {
                pcVar4 = (char *)bson_iter_dup_utf8(local_100,&local_104);
                if (pcVar4 != "bar") {
                  iVar2 = strcmp("bar",pcVar4);
                  if (iVar2 != 0) {
                    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d) \"%s\" != \"%s\"\n",0x49,
                            "bar",pcVar4);
                    abort();
                  }
                }
                if (local_104 != 3) {
                  fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)len == 3\n",0x4a);
                  abort();
                }
                bson_free(pcVar4);
                cVar1 = bson_iter_next(local_100);
                if (cVar1 == '\0') {
                  pcVar4 = "bson_iter_next (&iter)";
                  uStack_188 = 0x4c;
                }
                else {
                  iVar2 = bson_iter_type(local_100);
                  if (iVar2 == 2) {
                    pcVar4 = (char *)bson_iter_key(local_100);
                    iVar2 = strcmp(pcVar4,"bar");
                    if (iVar2 == 0) {
                      pcVar4 = (char *)bson_iter_utf8(local_100,0);
                      iVar2 = strcmp(pcVar4,"baz");
                      if (iVar2 == 0) {
                        cVar1 = bson_iter_next(local_100);
                        if (cVar1 == '\0') {
                          bson_destroy(uVar3);
                          return;
                        }
                        pcVar4 = "!bson_iter_next (&iter)";
                        uStack_188 = 0x50;
                      }
                      else {
                        pcVar4 = "!strcmp (bson_iter_utf8 (&iter, NULL), \"baz\")";
                        uStack_188 = 0x4f;
                      }
                    }
                    else {
                      pcVar4 = "!strcmp (bson_iter_key (&iter), \"bar\")";
                      uStack_188 = 0x4e;
                    }
                  }
                  else {
                    pcVar4 = "BSON_ITER_HOLDS_UTF8 (&iter)";
                    uStack_188 = 0x4d;
                  }
                }
              }
              else {
                pcVar4 = "!strcmp (bson_iter_utf8 (&iter, NULL), \"bar\")";
                uStack_188 = 0x47;
              }
            }
            else {
              pcVar4 = "!strcmp (bson_iter_key (&iter), \"foo\")";
              uStack_188 = 0x46;
            }
          }
          else {
            pcVar4 = "BSON_ITER_HOLDS_UTF8 (&iter)";
            uStack_188 = 0x45;
          }
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uStack_188,"test_bson_iter_utf8",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_utf8 (void)
{
   uint32_t len = 0;
   bson_iter_t iter;
   bson_t *b;
   char *s;

   b = bson_new ();
   BSON_ASSERT (bson_append_utf8 (b, "foo", -1, "bar", -1));
   BSON_ASSERT (bson_append_utf8 (b, "bar", -1, "baz", -1));
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_next (&iter));
   BSON_ASSERT (BSON_ITER_HOLDS_UTF8 (&iter));
   BSON_ASSERT (!strcmp (bson_iter_key (&iter), "foo"));
   BSON_ASSERT (!strcmp (bson_iter_utf8 (&iter, NULL), "bar"));
   s = bson_iter_dup_utf8 (&iter, &len);
   BSON_ASSERT_CMPSTR ("bar", s);
   BSON_ASSERT_CMPINT (len, ==, 3);
   bson_free (s);
   BSON_ASSERT (bson_iter_next (&iter));
   BSON_ASSERT (BSON_ITER_HOLDS_UTF8 (&iter));
   BSON_ASSERT (!strcmp (bson_iter_key (&iter), "bar"));
   BSON_ASSERT (!strcmp (bson_iter_utf8 (&iter, NULL), "baz"));
   BSON_ASSERT (!bson_iter_next (&iter));
   bson_destroy (b);
}